

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate(QHttpNetworkRequestPrivate *this)

{
  QHttpNetworkHeaderPrivate *in_RDI;
  
  QString::~QString((QString *)0x3090a3);
  QString::~QString((QString *)0x3090b1);
  QByteArray::~QByteArray((QByteArray *)0x3090bf);
  QHttpNetworkHeaderPrivate::~QHttpNetworkHeaderPrivate(in_RDI);
  return;
}

Assistant:

QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate()
{
}